

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O2

void __thiscall
shaping_clipper::limit_clip_spectrum(shaping_clipper *this,float *clip_spectrum,float *mask_curve)

{
  int iVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_XMM0_Db;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  complex<float> local_38;
  
  fVar4 = ABS(*clip_spectrum) / *mask_curve;
  if (1.0 < fVar4) {
    *clip_spectrum = *clip_spectrum / fVar4;
  }
  iVar2 = (this->oversample * this->size) / 2;
  iVar1 = this->size / 2 + 1;
  if (iVar2 <= iVar1) {
    iVar1 = iVar2;
  }
  for (lVar3 = 1; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    local_38._M_value = *(_ComplexT *)(clip_spectrum + lVar3 * 2);
    fVar4 = std::abs<float>(&local_38);
    fVar4 = (fVar4 + fVar4) / mask_curve[lVar3];
    if (1.0 < fVar4) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(clip_spectrum + lVar3 * 2);
      auVar6._4_4_ = fVar4;
      auVar6._0_4_ = fVar4;
      auVar6._8_4_ = extraout_XMM0_Db;
      auVar6._12_4_ = extraout_XMM0_Db;
      auVar6 = divps(auVar5,auVar6);
      *(long *)(clip_spectrum + lVar3 * 2) = auVar6._0_8_;
    }
  }
  if (this->size / 2 == (int)lVar3) {
    fVar4 = ABS(clip_spectrum[1]) / mask_curve[lVar3];
    if (1.0 < fVar4) {
      clip_spectrum[1] = clip_spectrum[1] / fVar4;
    }
  }
  return;
}

Assistant:

void shaping_clipper::limit_clip_spectrum(float* clip_spectrum, const float* mask_curve) {
    // bin 0
    float relative_distortion_level = std::abs(clip_spectrum[0]) / mask_curve[0];
    if (relative_distortion_level > 1.0) {
        clip_spectrum[0] /= relative_distortion_level;
    }
    // bin 1..N/2-1
    // When oversampling is on, the base nyquist bin is handled in this loop
    int i = 1;
    int bins_below_nyquist = std::min(this->size * this->oversample / 2, this->size / 2 + 1);
    for (; i < bins_below_nyquist; i++) {
        float real = clip_spectrum[i * 2];
        float imag = clip_spectrum[i * 2 + 1];
        // although the negative frequencies are omitted because they are redundant,
        // the magnitude of the positive frequencies are not doubled.
        // Multiply the magnitude by 2 to simulate adding up the + and - frequencies.
        relative_distortion_level = abs(std::complex<float>(real, imag)) * 2 / mask_curve[i];
        if (relative_distortion_level > 1.0) {
            clip_spectrum[i * 2] /= relative_distortion_level;
            clip_spectrum[i * 2 + 1] /= relative_distortion_level;
        }
    }
    // bin N/2
    // When oversampling is off, the base nyquist bins needs to be handled here.
    if (i == this->size / 2) {
        relative_distortion_level = std::abs(clip_spectrum[1]) / mask_curve[this->size / 2];
        if (relative_distortion_level > 1.0) {
            clip_spectrum[1] /= relative_distortion_level;
        }
    }
}